

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.h
# Opt level: O0

_Bool fy_input_is_lb(fy_input *fyi,int c)

{
  _Bool _Var1;
  int c_local;
  fy_input *fyi_local;
  
  _Var1 = fy_is_json_lb(c);
  if (_Var1) {
    fyi_local._7_1_ = true;
  }
  else if ((fyi == (fy_input *)0x0) || ((fyi->field_0x74 & 1) == 0)) {
    fyi_local._7_1_ = fy_is_yaml12_lb(c);
  }
  else {
    fyi_local._7_1_ = false;
  }
  return fyi_local._7_1_;
}

Assistant:

static inline bool fy_input_is_lb(const struct fy_input *fyi, int c) {
    /* '\r', '\n' are always linebreaks */
    if (fy_is_json_lb(c))
        return true;
    if (fyi && fyi->json_mode)
        return false;
    return fy_is_yaml12_lb(c);
}